

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant_const&>
          (QMovableArrayOps<QVariant> *this,qsizetype i,QVariant *args)

{
  QVariant **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  QVariant *pQVar4;
  QVariant *pQVar5;
  QVariant *__dest;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_80;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_005b969e:
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::QVariant((QVariant *)&local_58,args);
    bVar6 = (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.size != 0;
    QArrayDataPointer<QVariant>::detachAndGrow
              ((QArrayDataPointer<QVariant> *)this,(uint)(i == 0 && bVar6),1,(QVariant **)0x0,
               (QArrayDataPointer<QVariant> *)0x0);
    if (i == 0 && bVar6) {
      pQVar4 = (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr;
      *(undefined8 *)((long)&pQVar4[-1].d.data + 0x10) = local_58._16_8_;
      *(undefined1 **)&pQVar4[-1].d.field_0x18 = puStack_40;
      pQVar4[-1].d.data.shared = local_58.shared;
      *(undefined8 *)((long)&pQVar4[-1].d.data + 8) = local_58._8_8_;
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      local_58._16_8_ = 0;
      puStack_40 = (undefined1 *)0x2;
      ppQVar1 = &(this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      pQVar5 = (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr;
      pQVar4 = pQVar5 + i;
      __dest = pQVar4 + 1;
      local_80.nInserts = 1;
      local_80.bytes =
           ((this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.size - i) *
           0x20;
      local_80.data = (QArrayDataPointer<QVariant> *)this;
      local_80.displaceTo = __dest;
      memmove(__dest,pQVar5 + i,local_80.bytes);
      *(undefined8 *)((long)&(pQVar4->d).data + 0x10) = local_58._16_8_;
      *(undefined1 **)&(pQVar4->d).field_0x18 = puStack_40;
      (pQVar4->d).data.shared = local_58.shared;
      *(undefined8 *)((long)&(pQVar4->d).data + 8) = local_58._8_8_;
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      local_58._16_8_ = 0;
      puStack_40 = (undefined1 *)0x2;
      local_80.displaceFrom = __dest;
      Inserter::~Inserter(&local_80);
    }
    ::QVariant::~QVariant((QVariant *)&local_58);
  }
  else {
    if (((this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.size == i) &&
       (pQVar4 = (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr,
       (pDVar3->super_QArrayData).alloc !=
       ((long)((long)pQVar4 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 5) +
       i)) {
      ::QVariant::QVariant(pQVar4 + i,args);
    }
    else {
      if ((i != 0) ||
         (pQVar4 = (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr,
         (QVariant *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
         pQVar4)) goto LAB_005b969e;
      ::QVariant::QVariant(pQVar4 + -1,args);
      ppQVar1 = &(this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }